

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O0

int mbedtls_chachapoly_auth_decrypt
              (mbedtls_chachapoly_context *ctx,size_t length,uchar *nonce,uchar *aad,size_t aad_len,
              uchar *tag,uchar *input,uchar *output)

{
  byte bVar1;
  ulong uStack_60;
  int diff;
  size_t i;
  uchar check_tag [16];
  int ret;
  uchar *tag_local;
  size_t aad_len_local;
  uchar *aad_local;
  uchar *nonce_local;
  size_t length_local;
  mbedtls_chachapoly_context *ctx_local;
  
  check_tag[0xc] = 0x92;
  check_tag[0xd] = 0xff;
  check_tag[0xe] = 0xff;
  check_tag[0xf] = 0xff;
  check_tag._12_4_ =
       chachapoly_crypt_and_tag
                 (ctx,MBEDTLS_CHACHAPOLY_DECRYPT,length,nonce,aad,aad_len,input,output,(uchar *)&i);
  ctx_local._4_4_ = check_tag._12_4_;
  if (check_tag._12_4_ == 0) {
    bVar1 = 0;
    for (uStack_60 = 0; uStack_60 < 0x10; uStack_60 = uStack_60 + 1) {
      bVar1 = tag[uStack_60] ^ check_tag[uStack_60 - 8] | bVar1;
    }
    if (bVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      mbedtls_platform_zeroize(output,length);
      ctx_local._4_4_ = -0x56;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_chachapoly_auth_decrypt( mbedtls_chachapoly_context *ctx,
                                     size_t length,
                                     const unsigned char nonce[12],
                                     const unsigned char *aad,
                                     size_t aad_len,
                                     const unsigned char tag[16],
                                     const unsigned char *input,
                                     unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char check_tag[16];
    size_t i;
    int diff;
    CHACHAPOLY_VALIDATE_RET( ctx   != NULL );
    CHACHAPOLY_VALIDATE_RET( nonce != NULL );
    CHACHAPOLY_VALIDATE_RET( tag   != NULL );
    CHACHAPOLY_VALIDATE_RET( aad_len == 0 || aad    != NULL );
    CHACHAPOLY_VALIDATE_RET( length  == 0 || input  != NULL );
    CHACHAPOLY_VALIDATE_RET( length  == 0 || output != NULL );

    if( ( ret = chachapoly_crypt_and_tag( ctx,
                        MBEDTLS_CHACHAPOLY_DECRYPT, length, nonce,
                        aad, aad_len, input, output, check_tag ) ) != 0 )
    {
        return( ret );
    }

    /* Check tag in "constant-time" */
    for( diff = 0, i = 0; i < sizeof( check_tag ); i++ )
        diff |= tag[i] ^ check_tag[i];

    if( diff != 0 )
    {
        mbedtls_platform_zeroize( output, length );
        return( MBEDTLS_ERR_CHACHAPOLY_AUTH_FAILED );
    }

    return( 0 );
}